

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void ON_BrepTransformSwapSrfHelper(ON_Brep *brep,ON_NurbsSurface *nurbs_srf,int si)

{
  uint uVar1;
  ON_Object *source_object;
  ON_Object *pOVar2;
  ON_BrepFace *this;
  ulong uVar3;
  bool bVar4;
  ON_UserDataHolder udholder;
  ON_Object local_40;
  
  source_object = (ON_Object *)(brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si];
  ON_UserDataHolder::ON_UserDataHolder((ON_UserDataHolder *)&local_40);
  ON_UserDataHolder::MoveUserDataFrom((ON_UserDataHolder *)&local_40,source_object);
  uVar3 = 0;
  ON_UserDataHolder::MoveUserDataTo((ON_UserDataHolder *)&local_40,(ON_Object *)nurbs_srf,false);
  (brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si] = &nurbs_srf->super_ON_Surface;
  uVar1 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  this = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      (*source_object->_vptr_ON_Object[4])(source_object);
      ON_Object::~ON_Object(&local_40);
      return;
    }
    if (this->m_si == si) {
LAB_00412e12:
      bVar4 = ON_SurfaceProxy::ProxySurfaceIsTransposed(&this->super_ON_SurfaceProxy);
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,&nurbs_srf->super_ON_Surface);
      if (bVar4) {
        ON_SurfaceProxy::Transpose(&this->super_ON_SurfaceProxy);
      }
    }
    else {
      pOVar2 = (ON_Object *)ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
      if (pOVar2 == source_object) goto LAB_00412e12;
    }
    this = this + 1;
  } while( true );
}

Assistant:

static void ON_BrepTransformSwapSrfHelper( ON_Brep& brep, ON_NurbsSurface* nurbs_srf, int si )
{
  // Replace plane surface which could not be properly transformed
  // with nurbs_surface.
  ON_Surface* old_srf = brep.m_S[si];
  ON_UserDataHolder udholder;
  udholder.MoveUserDataFrom(*old_srf);
  udholder.MoveUserDataTo(*nurbs_srf,false);
  brep.m_S[si] = nurbs_srf;
  
  // Update faces to use new surface.
  const int fcount = brep.m_F.Count();
  ON_BrepFace* f = brep.m_F.Array();
  for ( int fi = 0; fi < fcount; fi++ )
  {
    if (f[fi].m_si == si || f[fi].ProxySurface() == old_srf )
    {
      const bool bIsTransposed = f[fi].ProxySurfaceIsTransposed();
      f[fi].SetProxySurface(nurbs_srf);
      if (bIsTransposed)
        f[fi].ON_SurfaceProxy::Transpose();
    }
  }

  delete old_srf;
}